

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v9::basic_format_specs<char>::basic_format_specs(basic_format_specs<char> *this)

{
  basic_format_specs<char> *this_local;
  
  this->width = 0;
  this->precision = -1;
  this->type = none;
  *(ushort *)&this->field_0x9 = *(ushort *)&this->field_0x9 & 0xfff0;
  *(ushort *)&this->field_0x9 = *(ushort *)&this->field_0x9 & 0xff8f;
  *(ushort *)&this->field_0x9 = *(ushort *)&this->field_0x9 & 0xff7f;
  *(ushort *)&this->field_0x9 = *(ushort *)&this->field_0x9 & 0xfeff;
  detail::fill_t<char>::fill_t(&this->fill);
  return;
}

Assistant:

constexpr basic_format_specs()
      : width(0),
        precision(-1),
        type(presentation_type::none),
        align(align::none),
        sign(sign::none),
        alt(false),
        localized(false) {}